

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.h
# Opt level: O1

void __thiscall
r_exec::MDLController::reduce_cache<r_exec::SecondaryMDLController>
          (MDLController *this,Fact *f_p_f_imdl,MDLController *controller)

{
  atomic_int_fast64_t *paVar1;
  _ReductionJob *this_00;
  _Mem *this_01;
  
  this_00 = (_ReductionJob *)operator_new(0x30);
  _ReductionJob::_ReductionJob(this_00);
  (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__BatchReductionJob_001c0720;
  this_00[1].super__Object._vptr__Object = (_func_int **)this;
  LOCK();
  paVar1 = &(this->super_HLPController).super_OController.super_Controller.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = (__int_type)f_p_f_imdl;
  if (f_p_f_imdl != (Fact *)0x0) {
    LOCK();
    paVar1 = &(f_p_f_imdl->super__Fact).super_LObject.super_Object<r_code::LObject,_r_exec::LObject>
              .super_LObject.super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_00[1].ijt = (uint64_t)controller;
  if (controller != (MDLController *)0x0) {
    LOCK();
    paVar1 = &(controller->super_HLPController).super_OController.super_Controller.super__Object.
              refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_01 = (_Mem *)r_code::Mem::Get();
  _Mem::pushReductionJob(this_01,this_00);
  return;
}

Assistant:

void reduce_cache(Fact *f_p_f_imdl, MDLController *controller)   // fwd; controller is the controller of the requirement which produced f_p_f_imdl.
    {
        BatchReductionJob<C, Fact, MDLController> *j = new BatchReductionJob<C, Fact, MDLController>((C *)this, f_p_f_imdl, controller);
        _Mem::Get()->pushReductionJob(j);
    }